

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

string * __thiscall mocker::Lexer::getToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  string *psVar8;
  size_t sVar9;
  byte *pbVar10;
  byte *pbVar11;
  allocator<char> local_49;
  size_t local_48;
  string *local_40;
  Position *local_38;
  
  pbVar2 = (byte *)(this->srcEnd)._M_current;
  pbVar10 = (byte *)(this->nxtBeg)._M_current;
  local_38 = &this->nxtPos;
  local_48 = (this->nxtPos).col;
  sVar9 = (this->nxtPos).line;
  pbVar11 = pbVar10;
  local_40 = __return_storage_ptr__;
  bVar4 = false;
  do {
    do {
      while ((bVar7 = bVar4, pbVar10 != pbVar2 && (iVar5 = isspace((int)(char)*pbVar10), iVar5 != 0)
             )) {
        local_48 = local_48 + 1;
        (this->nxtPos).col = local_48;
        if (*pbVar10 == 10) {
          sVar9 = sVar9 + 1;
          (this->nxtPos).line = sVar9;
          (this->nxtPos).col = 1;
          local_48 = 1;
        }
        pbVar10 = pbVar10 + 1;
        (this->nxtBeg)._M_current = (char *)pbVar10;
        pbVar11 = pbVar10;
        bVar4 = true;
      }
      psVar8 = local_40;
      bVar4 = false;
    } while (bVar7);
    if ((((long)pbVar2 - (long)pbVar10 < 2) || (*pbVar10 != 0x2f)) ||
       (pbVar3 = pbVar10, pbVar10[1] != 0x2f)) {
      if (pbVar10 == pbVar2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_49);
      }
      else {
        (this->curBeg)._M_current = (char *)pbVar11;
        sVar9 = local_38->col;
        (this->curPos).line = local_38->line;
        (this->curPos).col = sVar9;
        bVar1 = *pbVar11;
        iVar5 = ispunct((int)(char)bVar1);
        sVar9 = local_48;
        if (iVar5 == 0) {
          while ((pbVar10 != pbVar2 &&
                 ((bVar1 = *pbVar10, iVar5 = isalnum((int)(char)bVar1), (char)bVar1 == 0x5f ||
                  (iVar5 != 0))))) {
            pbVar10 = pbVar10 + 1;
            (this->nxtBeg)._M_current = (char *)pbVar10;
            (this->nxtPos).col = sVar9 + 1;
            sVar9 = sVar9 + 1;
          }
          (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
        }
        else {
          pbVar10 = pbVar11 + 1;
          (this->nxtBeg)._M_current = (char *)pbVar10;
          (this->nxtPos).col = local_48 + 1;
          if (pbVar10 != pbVar2) {
            uVar6 = (uint)bVar1;
            if (((bVar1 == *pbVar10) &&
                (((uVar6 < 0x3f && ((0x7000284000000000U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) ||
                 (uVar6 == 0x7c)))) ||
               (((bVar1 & 0xfd) == 0x3c || uVar6 == 0x21 && (*pbVar10 == 0x3d)))) {
              pbVar10 = pbVar11 + 2;
              (this->nxtBeg)._M_current = (char *)pbVar10;
              (this->nxtPos).col = local_48 + 2;
            }
          }
          (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
        }
        psVar8 = local_40;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_40,pbVar11,pbVar10);
      }
      return psVar8;
    }
    while( true ) {
      if (pbVar10 == pbVar2) break;
      if (*pbVar10 == 10) goto LAB_0016d1e7;
      pbVar10 = pbVar10 + 1;
      (this->nxtBeg)._M_current = (char *)pbVar10;
      pbVar11 = pbVar10;
      pbVar3 = pbVar3 + 1;
    }
    if (*pbVar10 == 10) {
LAB_0016d1e7:
      pbVar10 = pbVar10 + 1;
      (this->nxtBeg)._M_current = (char *)pbVar10;
      pbVar11 = pbVar3 + 1;
    }
    sVar9 = sVar9 + 1;
    (this->nxtPos).line = sVar9;
    (this->nxtPos).col = 1;
    local_48 = 1;
    bVar4 = false;
  } while( true );
}

Assistant:

std::string Lexer::getToken() {
  // skip the whitespaces and comments
  auto skipWs = [this]() -> bool /* skipped something? */ {
    bool res = false;
    while (nxtBeg != srcEnd && std::isspace(*nxtBeg)) {
      res = true;
      ++nxtPos.col;
      if (*nxtBeg == '\n') {
        ++nxtPos.line;
        nxtPos.col = 1;
      }
      ++nxtBeg;
    }
    return res;
  };
  auto skipComment = [this]() -> bool {
    if (srcEnd - nxtBeg < 2 || *nxtBeg != '/' || *(nxtBeg + 1) != '/')
      return false;
    while (nxtBeg != srcEnd && *nxtBeg != '\n')
      ++nxtBeg;
    if (*nxtBeg == '\n')
      ++nxtBeg;
    ++nxtPos.line;
    nxtPos.col = 1;
    return true;
  };
  while (skipWs() || skipComment())
    ;

  if (nxtBeg == srcEnd)
    return "";

  curBeg = nxtBeg;
  curPos = nxtPos;
  if (std::ispunct(*nxtBeg)) {
    auto now = *nxtBeg;
    ++nxtBeg;
    ++nxtPos.col;
    if (nxtBeg == srcEnd)
      return {curBeg, nxtBeg};

    if (now == *nxtBeg &&
        (now == '-' || now == '+' || now == '=' || now == '<' || now == '>' ||
         now == '&' || now == '|')) {
      ++nxtBeg;
      ++nxtPos.col;
    } else if (*nxtBeg == '=' && (now == '<' || now == '>')) {
      ++nxtBeg;
      ++nxtPos.col;
    } else if (now == '!' && *nxtBeg == '=') {
      ++nxtBeg;
      ++nxtPos.col;
    }
    return {curBeg, nxtBeg};
  }
  while (nxtBeg != srcEnd && (std::isalnum(*nxtBeg) || *nxtBeg == '_')) {
    ++nxtBeg;
    ++nxtPos.col;
  }
  return {curBeg, nxtBeg};
}